

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_builder.c
# Opt level: O0

void builder_generateCode
               (FILE *out,pattern_match_t *matches,pattern_analyse_t *analysation,_Bool returnString
               )

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  byte in_CL;
  FILE *in_RDX;
  s_pattern_match *in_RSI;
  FILE *in_RDI;
  FILE *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  s_pattern_match *local_10;
  
  bVar1 = in_CL & 1;
  local_10 = in_RSI;
  if (bVar1 != 0) {
    if ((in_RDX->_flags & 0x1000000) == 0) {
      if (((in_RDX->_flags & 0x10000) != 0) || ((in_RDX->field_0x4 & 1) != 0)) {
        fprintf(in_RDI,
                "__internal_hfunction->intToString(__internal_expressionString, EXPR_STRING_LENGTH, "
               );
      }
    }
    else {
      fprintf(in_RDI,
              "__internal_hfunction->floatToString(__internal_expressionString, EXPR_STRING_LENGTH, "
             );
    }
  }
  for (; local_10 != (s_pattern_match *)0x0; local_10 = local_10->next) {
    if (local_10->type == VARIABLE) {
      local_10 = builder_buildVariable
                           (in_RDX,(pattern_match_t *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                            (pattern_analyse_t *)in_stack_ffffffffffffffd8);
    }
    else if (local_10->type == STRING) {
      _Var2 = builder_buildStringCompare(in_stack_ffffffffffffffd8,(pattern_match_t *)0x107060);
      if (_Var2) {
        local_10 = local_10->next->next;
      }
      else {
        fprintf(in_RDI,"\"%s\"",local_10->string);
      }
    }
    else if (local_10->type == EQUATION) {
      iVar3 = strncmp(local_10->string,"eq",2);
      if (iVar3 == 0) {
        fprintf(in_RDI,"==");
      }
      else {
        iVar3 = strncmp(local_10->string,"ne",2);
        if (iVar3 == 0) {
          fprintf(in_RDI,"!=");
        }
        else {
          fprintf(in_RDI,"%s",local_10->string);
        }
      }
    }
    else if (local_10->type == INT) {
      fprintf(in_RDI,"%s",local_10->string);
    }
    else if (local_10->type == FLOAT) {
      fprintf(in_RDI,"%s",local_10->string);
    }
    else if (local_10->type == OPERATOR) {
      fprintf(in_RDI,"%s",local_10->string);
    }
    else if (local_10->type == POPEN) {
      fprintf(in_RDI,"(");
    }
    else if (local_10->type == PCLOSE) {
      fprintf(in_RDI,")");
    }
    else if (local_10->type == NOT) {
      fprintf(in_RDI,"!");
    }
  }
  if ((bVar1 & 1) != 0) {
    if ((in_RDX->_flags & 0x1000000) == 0) {
      if (((in_RDX->_flags & 0x10000) != 0) || ((in_RDX->field_0x4 & 1) != 0)) {
        fprintf(in_RDI,")");
      }
    }
    else {
      fprintf(in_RDI,")");
    }
  }
  return;
}

Assistant:

void builder_generateCode(FILE *out, pattern_match_t *matches, pattern_analyse_t *analysation, bool returnString) {

	if ( returnString ) {
		if ( analysation->hasFloat ) {
			fprintf(out, "__internal_hfunction->floatToString(__internal_expressionString, EXPR_STRING_LENGTH, ");
		} else if ( analysation->hasInt || analysation->hasEquation ) {
			fprintf(out, "__internal_hfunction->intToString(__internal_expressionString, EXPR_STRING_LENGTH, ");
		}
	}

	while ( matches != NULL ) {
		if ( matches->type == VARIABLE ) {
			matches = builder_buildVariable(out, matches, analysation);
		} else if ( matches->type == STRING ) {
			if ( builder_buildStringCompare(out, matches) ) {
				matches = matches->next->next;
			} else {
				fprintf(out, "\"%s\"", matches->string);
			}
		} else if ( matches->type == EQUATION ) {
			if ( !strncmp(matches->string, "eq", 2) ) {
				fprintf(out, "==");
			} else if ( !strncmp(matches->string, "ne", 2) ) {
				fprintf(out, "!=");
			} else {
				fprintf(out, "%s", matches->string);
			}
		} else if ( matches->type == INT ) {
			fprintf(out, "%s", matches->string);
		} else if ( matches->type == FLOAT ) {
			fprintf(out, "%s", matches->string);
		} else if ( matches->type == OPERATOR ) {
			fprintf(out, "%s", matches->string);
		} else if ( matches->type == POPEN ) {
			fprintf(out, "(");
		} else if ( matches->type == PCLOSE ) {
			fprintf(out, ")");
		} else if ( matches->type == NOT ) {
			fprintf(out, "!");
		}

		matches = matches->next;
	}

	if ( returnString ) {
		if ( analysation->hasFloat ) {
			fprintf(out, ")");
		} else if ( analysation->hasInt || analysation->hasEquation ) {
			fprintf(out, ")");
		}
	}
}